

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeCommand.cxx
# Opt level: O3

bool cmIncludeCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  PolicyStatus PVar9;
  mapped_type *pmVar10;
  undefined8 uVar11;
  iterator iVar12;
  string *psVar13;
  cmGlobalGenerator *this;
  ostream *poVar14;
  size_t sVar15;
  PolicyID id;
  PolicyID id_00;
  uint uVar16;
  MessageType t;
  ulong uVar17;
  pointer pbVar18;
  _Alloc_hider __s;
  char *__s_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  string_view value;
  string_view value_00;
  bool system;
  string listFile;
  string m;
  string fname_abs;
  string fname;
  string resultVarName;
  ostringstream e;
  bool local_279;
  cmExecutionStatus *local_278;
  undefined4 local_26c;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  if (cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
      ::DeprecatedModules_abi_cxx11_ == '\0') {
    cmIncludeCommand();
  }
  if (cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
      ::DeprecatedModules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    local_1a8._0_8_ = local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"Documentation","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
              ::operator[](&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                            ::DeprecatedModules_abi_cxx11_,(key_type *)local_1a8);
    *pmVar10 = CMP0106;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0]._M_allocated_capacity + 1));
    }
    local_1a8._0_8_ = local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"WriteCompilerDetectionHeader","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
              ::operator[](&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                            ::DeprecatedModules_abi_cxx11_,(key_type *)local_1a8);
    *pmVar10 = CMP0120;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0]._M_allocated_capacity + 1));
    }
  }
  pbVar18 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 == pbVar18 || 0x80 < (ulong)((long)pbVar1 - (long)pbVar18)) {
    local_1a8._0_8_ = local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "called with wrong number of arguments.  include() only takes one file.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0]._M_allocated_capacity + 1));
    }
    return false;
  }
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  pcVar2 = (pbVar18->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,pcVar2,pcVar2 + pbVar18->_M_string_length);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  pbVar18 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar18) < 0x21) {
    local_26c = 0;
    bVar7 = false;
  }
  else {
    uVar17 = 1;
    bVar7 = false;
    local_26c = 0;
    local_278 = status;
    do {
      uVar16 = (uint)uVar17;
      iVar8 = std::__cxx11::string::compare((char *)(pbVar18 + uVar17));
      if (iVar8 == 0) {
        bVar4 = !bVar7;
        bVar7 = true;
        if (bVar4) goto LAB_001ff8e8;
        local_1a8._0_8_ = local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"called with invalid arguments: OPTIONAL used twice","");
        std::__cxx11::string::_M_assign((string *)&local_278->Error);
LAB_001ffb84:
        local_228.field_2._M_allocated_capacity = local_198[0]._M_allocated_capacity;
        local_228._M_dataplus._M_p = (pointer)local_1a8._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._0_8_ != local_198) {
LAB_001ffb99:
          operator_delete(local_228._M_dataplus._M_p,
                          (ulong)(local_228.field_2._M_allocated_capacity + 1));
        }
LAB_001ffba1:
        bVar4 = false;
        goto LAB_002000fb;
      }
      iVar8 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar17));
      if (iVar8 == 0) {
        if (local_1e8._M_string_length == 0) {
          uVar16 = uVar16 + 1;
          if ((ulong)uVar16 <
              (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5)) {
            std::__cxx11::string::_M_assign((string *)&local_1e8);
            goto LAB_001ff8e8;
          }
          local_1a8._0_8_ = local_198;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"called with no value for RESULT_VARIABLE.","");
          std::__cxx11::string::_M_assign((string *)&local_278->Error);
        }
        else {
          local_1a8._0_8_ = local_198;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,
                     "called with invalid arguments: only one result variable allowed","");
          std::__cxx11::string::_M_assign((string *)&local_278->Error);
        }
        goto LAB_001ffb84;
      }
      uVar11 = std::__cxx11::string::compare
                         ((char *)((args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + uVar17));
      if ((int)uVar11 != 0) {
        if (uVar16 < 2) goto LAB_001ff8e8;
        pbVar18 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_198[0]._8_8_ = pbVar18[uVar17]._M_dataplus._M_p;
        local_198[0]._0_8_ = pbVar18[uVar17]._M_string_length;
        local_1a8._0_8_ = &DAT_0000001e;
        local_1a8._8_8_ = "called with invalid argument: ";
        views_00._M_len = 2;
        views_00._M_array = (iterator)local_1a8;
        cmCatViews_abi_cxx11_(&local_228,views_00);
        std::__cxx11::string::_M_assign((string *)&local_278->Error);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) goto LAB_001ffb99;
        goto LAB_001ffba1;
      }
      local_26c = (undefined4)CONCAT71((int7)((ulong)uVar11 >> 8),1);
LAB_001ff8e8:
      uVar17 = (ulong)(uVar16 + 1);
      pbVar18 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      status = local_278;
    } while (uVar17 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar18 >> 5
                             ));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_string_length ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    pcVar3 = status->Makefile;
    local_1a8._0_8_ = local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"include() given empty file name (ignored).","");
    cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,(string *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0]._M_allocated_capacity + 1));
    }
    bVar4 = true;
    goto LAB_002000fb;
  }
  bVar4 = cmsys::SystemTools::FileIsFullPath(&local_208);
  if (!bVar4) {
    local_279 = false;
    local_1a8._0_8_ = local_208._M_string_length;
    local_1a8._8_8_ = local_208._M_dataplus._M_p;
    local_198[0]._M_allocated_capacity =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x6;
    local_198[0]._8_8_ = (long)"/Modules/Internal/OSRelease/*.cmake" + 0x1d;
    views._M_len = 2;
    views._M_array = (iterator)local_1a8;
    cmCatViews_abi_cxx11_(&local_228,views);
    cmMakefile::GetModulesFile(&local_268,status->Makefile,&local_228,&local_279);
    if ((local_279 == true) &&
       (iVar12 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
                 ::find(&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::DeprecatedModules_abi_cxx11_._M_t,&local_208),
       (_Rb_tree_header *)iVar12._M_node !=
       &cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
        ::DeprecatedModules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header)) {
      PVar9 = cmMakefile::GetPolicyStatus(status->Makefile,iVar12._M_node[2]._M_color,false);
      if (PVar9 - NEW < 3) {
        std::__cxx11::string::operator=((string *)&local_268,"");
      }
      else if (PVar9 == WARN) {
        pcVar3 = status->Makefile;
        cmPolicies::GetPolicyWarning_abi_cxx11_
                  (&local_1c8,(cmPolicies *)(ulong)iVar12._M_node[2]._M_color,id);
        local_1a8._0_8_ = local_1c8._M_string_length;
        local_1a8._8_8_ = local_1c8._M_dataplus._M_p;
        local_198[0]._M_allocated_capacity =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x1;
        local_198[0]._8_8_ =
             (long)
             ")\n  list(APPEND _cmake_expected_targets \"${_cmake_expected_target}\")\n  if(TARGET \"${_cmake_expected_target}\")\n    list(APPEND _cmake_targets_defined \"${_cmake_expected_target}\")\n  else()\n    list(APPEND _cmake_targets_not_defined \"${_cmake_expected_target}\")\n  endif()\nendforeach()\nunset(_cmake_expected_target)\nif(_cmake_targets_defined STREQUAL _cmake_expected_targets)\n  unset(_cmake_targets_defined)\n  unset(_cmake_targets_not_defined)\n  unset(_cmake_expected_targets)\n  unset(CMAKE_IMPORT_FILE_VERSION)\n  cmake_policy(POP)\n  return()\nendif()\nif(NOT _cmake_targets_defined STREQUAL \"\")\n  string(REPLACE \";\" \", \" _cmake_targets_defined_text \"${_cmake_targets_defined}\")\n  string(REPLACE \";\" \", \" _cmake_targets_not_defined_text \"${_cmake_targets_not_defined}\")\n  message(FATAL_ERROR \"Some (but not all) targets in this export set were already defined.\\nTargets Defined: ${_cmake_targets_defined_text}\\nTargets not yet defined: ${_cmake_targets_not_defined_text}\\n\")\nendif()\nunset(_cmake_targets_defined)\nunset(_cmake_targets_not_defined)\nunset(_cmake_expected_targets)\n\n\n"
             + 0x431;
        views_01._M_len = 2;
        views_01._M_array = (iterator)local_1a8;
        cmCatViews_abi_cxx11_(&local_248,views_01);
        cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if (local_268._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&local_208);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,
                      (ulong)(local_228.field_2._M_allocated_capacity + 1));
    }
  }
  psVar13 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
  cmsys::SystemTools::CollapseFullPath(&local_228,&local_208,psVar13);
  this = cmMakefile::GetGlobalGenerator(status->Makefile);
  bVar4 = cmGlobalGenerator::IsExportedTargetsFile(this,&local_228);
  if (bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    local_278 = status;
    PVar9 = cmMakefile::GetPolicyStatus(status->Makefile,CMP0024,false);
    if (2 < PVar9 - NEW) {
      if (PVar9 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_268,(cmPolicies *)0x18,id_00);
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,local_268._M_dataplus._M_p,
                             local_268._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        bVar4 = false;
        __s_00 = "should";
        t = AUTHOR_WARNING;
        goto LAB_001ffd80;
      }
LAB_001ffe61:
      cmGlobalGenerator::CreateGenerationObjects(this,AllTargets);
      cmGlobalGenerator::GenerateImportFile(this,&local_228);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      status = local_278;
      goto LAB_001ffe9e;
    }
    t = FATAL_ERROR;
    bVar4 = true;
    __s_00 = "may";
LAB_001ffd80:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"The file\n  ",0xb);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_228._M_dataplus._M_p,local_228._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"\nwas generated by the export() command.  It ",0x2c);
    sVar15 = strlen(__s_00);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,__s_00,sVar15);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,
               " not be used as the argument to the include() command.  Use ALIAS targets instead to refer to targets by alternative names.\n"
               ,0x7c);
    pcVar3 = local_278->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar3,t,&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if (!bVar4) goto LAB_001ffe61;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar4 = false;
  }
  else {
LAB_001ffe9e:
    psVar13 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
    cmsys::SystemTools::CollapseFullPath(&local_268,&local_208,psVar13);
    bVar5 = cmsys::SystemTools::FileExists(&local_268);
    bVar6 = cmsys::SystemTools::FileIsDirectory(&local_268);
    if (bVar5 && !bVar6) {
LAB_001fff7e:
      bVar5 = cmMakefile::ReadDependentFile(status->Makefile,&local_268,(bool)((byte)local_26c & 1))
      ;
      if (local_1e8._M_string_length != 0) {
        pcVar3 = status->Makefile;
        __s._M_p = local_228._M_dataplus._M_p;
        if (!bVar5) {
          __s._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x6ab080;
        }
        sVar15 = strlen(__s._M_p);
        value_00._M_str = __s._M_p;
        value_00._M_len = sVar15;
        cmMakefile::AddDefinition(pcVar3,&local_1e8,value_00);
      }
      bVar4 = true;
      if (((!bVar5 && !bVar7) && (cmSystemTools::s_FatalErrorOccurred == false)) &&
         (bVar7 = cmSystemTools::GetInterruptFlag(), !bVar7)) {
        local_1a8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x21;
        local_1a8._8_8_ = "could not load requested file:\n  ";
        local_198[0]._M_allocated_capacity = local_208._M_string_length;
        local_198[0]._8_8_ = local_208._M_dataplus._M_p;
        views_03._M_len = 2;
        views_03._M_array = (iterator)local_1a8;
        cmCatViews_abi_cxx11_(&local_248,views_03);
        std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_002000a8:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        bVar4 = false;
      }
    }
    else {
      if (local_1e8._M_string_length != 0) {
        value._M_str = "NOTFOUND";
        value._M_len = 8;
        cmMakefile::AddDefinition(status->Makefile,&local_1e8,value);
      }
      bVar4 = true;
      if (!bVar7) {
        if (bVar5) {
          if (!bVar6) goto LAB_001fff7e;
          local_1a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x21;
          local_1a8._8_8_ = "requested file is a directory:\n  ";
          local_198[0]._M_allocated_capacity = local_208._M_string_length;
          local_198[0]._8_8_ = local_208._M_dataplus._M_p;
          views_02._M_len = 2;
          views_02._M_array = (iterator)local_1a8;
          cmCatViews_abi_cxx11_(&local_248,views_02);
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
        else {
          local_1a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x21;
          local_1a8._8_8_ = "could not find requested file:\n  ";
          local_198[0]._M_allocated_capacity = local_208._M_string_length;
          local_198[0]._8_8_ = local_208._M_dataplus._M_p;
          views_04._M_len = 2;
          views_04._M_array = (iterator)local_1a8;
          cmCatViews_abi_cxx11_(&local_248,views_04);
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
        goto LAB_002000a8;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,(ulong)(local_228.field_2._M_allocated_capacity + 1))
    ;
  }
LAB_002000fb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                             local_1e8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool cmIncludeCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  static std::map<std::string, cmPolicies::PolicyID> DeprecatedModules;
  if (DeprecatedModules.empty()) {
    DeprecatedModules["Documentation"] = cmPolicies::CMP0106;
    DeprecatedModules["WriteCompilerDetectionHeader"] = cmPolicies::CMP0120;
  }

  if (args.empty() || args.size() > 4) {
    status.SetError("called with wrong number of arguments.  "
                    "include() only takes one file.");
    return false;
  }
  bool optional = false;
  bool noPolicyScope = false;
  std::string fname = args[0];
  std::string resultVarName;

  for (unsigned int i = 1; i < args.size(); i++) {
    if (args[i] == "OPTIONAL") {
      if (optional) {
        status.SetError("called with invalid arguments: OPTIONAL used twice");
        return false;
      }
      optional = true;
    } else if (args[i] == "RESULT_VARIABLE") {
      if (!resultVarName.empty()) {
        status.SetError("called with invalid arguments: "
                        "only one result variable allowed");
        return false;
      }
      if (++i < args.size()) {
        resultVarName = args[i];
      } else {
        status.SetError("called with no value for RESULT_VARIABLE.");
        return false;
      }
    } else if (args[i] == "NO_POLICY_SCOPE") {
      noPolicyScope = true;
    } else if (i > 1) // compat.: in previous cmake versions the second
                      // parameter was ignored if it wasn't "OPTIONAL"
    {
      std::string errorText =
        cmStrCat("called with invalid argument: ", args[i]);
      status.SetError(errorText);
      return false;
    }
  }

  if (fname.empty()) {
    status.GetMakefile().IssueMessage(
      MessageType::AUTHOR_WARNING,
      "include() given empty file name (ignored).");
    return true;
  }

  if (!cmSystemTools::FileIsFullPath(fname)) {
    bool system = false;
    // Not a path. Maybe module.
    std::string module = cmStrCat(fname, ".cmake");
    std::string mfile = status.GetMakefile().GetModulesFile(module, system);

    if (system) {
      auto ModulePolicy = DeprecatedModules.find(fname);
      if (ModulePolicy != DeprecatedModules.end()) {
        cmPolicies::PolicyStatus PolicyStatus =
          status.GetMakefile().GetPolicyStatus(ModulePolicy->second);
        switch (PolicyStatus) {
          case cmPolicies::WARN: {
            status.GetMakefile().IssueMessage(
              MessageType::AUTHOR_WARNING,
              cmStrCat(cmPolicies::GetPolicyWarning(ModulePolicy->second),
                       "\n"));
            CM_FALLTHROUGH;
          }
          case cmPolicies::OLD:
            break;
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::NEW:
            mfile = "";
            break;
        }
      }
    }

    if (!mfile.empty()) {
      fname = mfile;
    }
  }

  std::string fname_abs = cmSystemTools::CollapseFullPath(
    fname, status.GetMakefile().GetCurrentSourceDirectory());

  cmGlobalGenerator* gg = status.GetMakefile().GetGlobalGenerator();
  if (gg->IsExportedTargetsFile(fname_abs)) {
    const char* modal = nullptr;
    std::ostringstream e;
    MessageType messageType = MessageType::AUTHOR_WARNING;

    switch (status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0024)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0024) << "\n";
        modal = "should";
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        modal = "may";
        messageType = MessageType::FATAL_ERROR;
    }
    if (modal) {
      e << "The file\n  " << fname_abs
        << "\nwas generated by the export() "
           "command.  It "
        << modal
        << " not be used as the argument to the "
           "include() command.  Use ALIAS targets instead to refer to targets "
           "by alternative names.\n";
      status.GetMakefile().IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
    gg->CreateGenerationObjects();
    gg->GenerateImportFile(fname_abs);
  }

  std::string listFile = cmSystemTools::CollapseFullPath(
    fname, status.GetMakefile().GetCurrentSourceDirectory());

  const bool fileDoesnotExist = !cmSystemTools::FileExists(listFile);
  const bool fileIsDirectory = cmSystemTools::FileIsDirectory(listFile);
  if (fileDoesnotExist || fileIsDirectory) {
    if (!resultVarName.empty()) {
      status.GetMakefile().AddDefinition(resultVarName, "NOTFOUND");
    }
    if (optional) {
      return true;
    }
    if (fileDoesnotExist) {
      status.SetError(cmStrCat("could not find requested file:\n  ", fname));
      return false;
    }
    if (fileIsDirectory) {
      status.SetError(cmStrCat("requested file is a directory:\n  ", fname));
      return false;
    }
  }

  bool readit =
    status.GetMakefile().ReadDependentFile(listFile, noPolicyScope);

  // add the location of the included file if a result variable was given
  if (!resultVarName.empty()) {
    status.GetMakefile().AddDefinition(
      resultVarName, readit ? fname_abs.c_str() : "NOTFOUND");
  }

  if (!optional && !readit && !cmSystemTools::GetFatalErrorOccurred()) {
    std::string m = cmStrCat("could not load requested file:\n  ", fname);
    status.SetError(m);
    return false;
  }
  return true;
}